

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O0

QString * Utils::exec(QString *__return_storage_ptr__,QString *cmd)

{
  char *pcVar1;
  FILE *pFVar2;
  runtime_error *this;
  char local_158 [8];
  char buffer [256];
  QByteArray local_40;
  FILE *local_28;
  FILE *pipe;
  QString *local_18;
  QString *cmd_local;
  QString *result;
  
  pipe._7_1_ = 0;
  local_18 = cmd;
  cmd_local = __return_storage_ptr__;
  QString::QString(__return_storage_ptr__);
  QString::toLocal8Bit(&local_40,local_18);
  pcVar1 = QByteArray::constData(&local_40);
  pFVar2 = popen(pcVar1,"r");
  QByteArray::~QByteArray(&local_40);
  local_28 = pFVar2;
  if (pFVar2 == (FILE *)0x0) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"popen() failed!");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  while (pcVar1 = fgets(local_158,0x100,local_28), pcVar1 != (char *)0x0) {
    QString::operator+=(__return_storage_ptr__,local_158);
  }
  pclose(local_28);
  return __return_storage_ptr__;
}

Assistant:

QString exec(const QString &cmd) {
    QString result;
    FILE* pipe = popen(cmd.toLocal8Bit().constData(), "r");

    if (!pipe)
        throw runtime_error("popen() failed!");

    try {
        char buffer[BUFFER_SIZE];

        while (fgets(buffer, sizeof(buffer), pipe) != nullptr) {
            result += buffer;
        }
    } catch (...) {
        pclose(pipe);
        throw;
    }

    pclose(pipe);

    return result;
}